

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

void ON_Font::GetRunBounds
               (ON_Font *font,wchar_t *text,double font_height_pixels,
               TextHorizontalAlignment horizontal_alignment,TextVerticalAlignment vertical_alignment
               ,ON_2dPoint *bounds_min,ON_2dPoint *bounds_max,int *line_count)

{
  ON_2dPoint OVar1;
  ON_2dPoint OVar2;
  ON_2dPoint OVar3;
  ON_2dPoint OVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ON_Font *this;
  ON_FontMetrics *pOVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  ON_2dVector local_b8;
  ON_wString run;
  ON_2dPoint last_line_basepoint;
  ON_TextBox text_box;
  
  *line_count = 0;
  dVar11 = ON_2dPoint::Origin.y;
  bounds_min->x = ON_2dPoint::Origin.x;
  bounds_min->y = dVar11;
  dVar11 = ON_2dPoint::Origin.y;
  bounds_max->x = ON_2dPoint::Origin.x;
  bounds_max->y = dVar11;
  ON_wString::ON_wString(&run,text);
  iVar6 = ON_wString::Length(&run);
  if (iVar6 < 1) goto LAB_004a7ccc;
  this = ManagedFont(font);
  if (this == (ON_Font *)0x0) {
    this = &Default;
  }
  pOVar8 = FontMetrics(this);
  uVar9 = (uint)pOVar8->m_ascent_of_capital;
  iVar6 = pOVar8->m_line_space;
  text_box.m_bbmin = ON_2dex::Unset;
  text_box.m_bbmax = ON_2dex::Unset;
  text_box.m_max_basepoint = ON_2dex::Zero;
  text_box.m_advance = ON_2dex::Zero;
  iVar7 = ON_FontGlyph::GetGlyphListBoundingBox(text,this,&text_box);
  *line_count = iVar7;
  if ((iVar7 < 0) || (bVar5 = ON_TextBox::IsSet(&text_box), !bVar5)) goto LAB_004a7ccc;
  OVar1.y._0_4_ = SUB84((double)text_box.m_bbmin.j,0);
  OVar1.x = (double)text_box.m_bbmin.i;
  OVar1.y._4_4_ = (int)((ulong)(double)text_box.m_bbmin.j >> 0x20);
  *bounds_min = OVar1;
  OVar2.y._0_4_ = SUB84((double)text_box.m_bbmax.j,0);
  OVar2.x = (double)text_box.m_bbmax.i;
  OVar2.y._4_4_ = (int)((ulong)(double)text_box.m_bbmax.j >> 0x20);
  *bounds_max = OVar2;
  dVar10 = ON_2dPoint::Origin.y;
  dVar11 = ON_2dPoint::Origin.x;
  ON_2dPoint::ON_2dPoint
            (&last_line_basepoint,ON_2dPoint::Origin.x,(double)((1 - *line_count) * iVar6));
  local_b8.x = ON_2dVector::ZeroVector.x;
  local_b8.y = ON_2dVector::ZeroVector.y;
  if (horizontal_alignment == Left) {
    local_b8.x = -dVar11;
  }
  else if (horizontal_alignment == Center) {
    local_b8.x = (double)text_box.m_max_basepoint.i * -0.5 - dVar11;
  }
  else if (horizontal_alignment == Right) {
    local_b8.x = -dVar11 - (double)text_box.m_max_basepoint.i;
  }
  switch(vertical_alignment) {
  case Top:
    local_b8.y = -dVar10 - (double)uVar9;
    break;
  case MiddleOfTop:
    local_b8.y = (double)uVar9 * -0.5 - dVar10;
    break;
  case BottomOfTop:
    goto switchD_004a7bf8_caseD_2;
  case Middle:
    local_b8.y = (double)(int)((*line_count + -1) * iVar6 + uVar9) * 0.5;
    goto LAB_004a7c34;
  case MiddleOfBottom:
    local_b8.y = (double)uVar9 * -0.5;
LAB_004a7c34:
    local_b8.y = local_b8.y - last_line_basepoint.y;
    break;
  case Bottom:
    dVar10 = last_line_basepoint.y;
    goto switchD_004a7bf8_caseD_2;
  case BottomOfBoundingBox:
    dVar10 = bounds_min->y;
switchD_004a7bf8_caseD_2:
    local_b8.y = -dVar10;
  }
  ON_2dPoint::operator+=(bounds_min,&local_b8);
  ON_2dPoint::operator+=(bounds_max,&local_b8);
  dVar11 = font_height_pixels * 0.00390625;
  if (0.0 < dVar11) {
    dVar10 = (double)text_box.m_bbmin.j * dVar11;
    OVar3.y._0_4_ = SUB84(dVar10,0);
    OVar3.x = (double)text_box.m_bbmin.i * dVar11;
    OVar3.y._4_4_ = (int)((ulong)dVar10 >> 0x20);
    *bounds_min = OVar3;
    dVar10 = (double)text_box.m_bbmax.j * dVar11;
    OVar4.y._0_4_ = SUB84(dVar10,0);
    OVar4.x = (double)text_box.m_bbmax.i * dVar11;
    OVar4.y._4_4_ = (int)((ulong)dVar10 >> 0x20);
    *bounds_max = OVar4;
  }
LAB_004a7ccc:
  ON_wString::~ON_wString(&run);
  return;
}

Assistant:

void ON_Font::GetRunBounds(
  const ON_Font& font,
  const wchar_t* text,
  double font_height_pixels,
  ON::TextHorizontalAlignment horizontal_alignment,
  ON::TextVerticalAlignment vertical_alignment,
  ON_2dPoint& bounds_min,
  ON_2dPoint& bounds_max, 
  int& line_count
)
{
  line_count = 0;
  bounds_min = ON_2dPoint::Origin;
  bounds_max = ON_2dPoint::Origin;

  ON_wString run = text;
  int textlength = run.Length();
  if(textlength < 1)
    return;

  const ON_Font* managed_font = font.ManagedFont();
  if (nullptr == managed_font)
    managed_font = &ON_Font::Default;

  const ON_FontMetrics& fm = managed_font->FontMetrics();

  const int height_of_I = fm.AscentOfCapital();
  const int height_of_LF = fm.LineSpace();

  ON_TextBox text_box;
  line_count = ON_FontGlyph::GetGlyphListBoundingBox(text, managed_font, text_box);
  if ( line_count < 0 || false == text_box.IsSet())
    return;

  bounds_min.x = text_box.m_bbmin.i;
  bounds_min.y = text_box.m_bbmin.j;

  bounds_max.x = text_box.m_bbmax.i;
  bounds_max.y = text_box.m_bbmax.j;

  // in text_box coordinate system (0.0) = left most baseline point of first line.
  const ON_2dPoint first_line_basepoint = ON_2dPoint::Origin;
  const ON_2dPoint last_line_basepoint(first_line_basepoint.x, -(line_count - 1)*height_of_LF);

  ON_2dVector offset = ON_2dVector::ZeroVector;

  switch (horizontal_alignment)
  {
  case ON::TextHorizontalAlignment::Left:
    offset.x = -first_line_basepoint.x;
    break;

  case ON::TextHorizontalAlignment::Center:
    // Text command uses m_max_basepoint (not bbmax)
    offset.x = -first_line_basepoint.x - 0.5*text_box.m_max_basepoint.i;
    break;

  case ON::TextHorizontalAlignment::Right:
    // Text command uses m_max_basepoint (not bbmax)
    offset.x = -first_line_basepoint.x - text_box.m_max_basepoint.i;
    break;
  default:
    break;
  }

  switch (vertical_alignment)
  {
  case ON::TextVerticalAlignment::Top:
    // (*,0) is at the top of an "I" on the first line.
    offset.y = -first_line_basepoint.y - height_of_I;
    break;
  case ON::TextVerticalAlignment::MiddleOfTop:
    // (*,0) is at the middle of an "I" on the first line.
    offset.y = -first_line_basepoint.y - 0.5*height_of_I;
    break;
  case ON::TextVerticalAlignment::BottomOfTop:
    // (*,0) is at the baseline of the first line.
    offset.y = -first_line_basepoint.y;
    break;

  case ON::TextVerticalAlignment::Middle:
    {
      // (*,0) is the vertical middle of lines (not vertical middle of glyph bounding box)
      double h = (line_count - 1)*height_of_LF + height_of_I;
      offset.y = -last_line_basepoint.y + 0.5*h;
    }
    break;

  case ON::TextVerticalAlignment::MiddleOfBottom:
    // (*,0) is at the middle of an "I" on the last line.
    offset.y = -last_line_basepoint.y  - 0.5*height_of_I;
    break;
  case ON::TextVerticalAlignment::Bottom:
    // (*,0) is at the basline of the last line.
    offset.y = -last_line_basepoint.y;
    break;
  case ON::TextVerticalAlignment::BottomOfBoundingBox:
    // (*,0) is on the bottom the the glyphs' bounding box
    offset.y = -bounds_min.y;
    break;
  default:
    break;
  }

  bounds_min += offset;
  bounds_max += offset;

  // scale is applied last.
  const double scale = font_height_pixels / (double)ON_Font::Constants::AnnotationFontCellHeight;
  if (scale > 0.0)
  {
    bounds_min.x = scale * text_box.m_bbmin.i;
    bounds_max.x = scale * text_box.m_bbmax.i;
    bounds_min.y = scale * text_box.m_bbmin.j;
    bounds_max.y = scale * text_box.m_bbmax.j;
  }
}